

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int process_opts(int argc,char **argv,nt_opts *opts)

{
  str_list *slist;
  str_list *slist_00;
  int_list *ilist;
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ushort **ppuVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  str_list *slist_01;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int iStack_90;
  
  memset(opts,0,0x900);
  opts->new_datatype = 4;
  opts->debug = 1;
  opts->new_dim[0] = 3;
  opts->new_dim[1] = 1;
  opts->new_dim[2] = 1;
  opts->new_dim[3] = 1;
  if (argc < 2) {
LAB_00104750:
    pcVar7 = *argv;
    iStack_90 = 2;
  }
  else {
    slist = &opts->elist;
    slist_00 = &opts->infiles;
    ilist = &opts->etypes;
    uVar5 = (ulong)(uint)argc;
    iVar2 = 1;
    while( true ) {
      if (argc <= iVar2) {
        if (opts->make_im != 0) {
          if (0 < slist_00->len) {
            fwrite("** -infiles is invalid when using -make_im\n",0x2b,1,_stderr);
            return -1;
          }
          opts->cbl = 1;
          iVar2 = add_string(slist_00,"MAKE_IM");
          if (iVar2 != 0) {
            return -1;
          }
        }
        if ((opts->add_exts != 0) && (slist->len != ilist->len)) {
          fprintf(_stderr,"** ext list length (%d) != etype length (%d)\n");
          return -1;
        }
        g_debug = opts->debug;
        nifti_set_debug_level(g_debug);
        fill_cmd_string(opts,argc,argv);
        if (2 < g_debug) {
          disp_nt_opts("options read: ",opts);
          return 0;
        }
        return 0;
      }
      lVar8 = (long)iVar2;
      pcVar7 = argv[lVar8];
      iVar3 = strncmp(pcVar7,"-help_datatypes",9);
      if (iVar3 == 0) {
        if (iVar2 + 1 < argc) {
          switch((*argv[iVar2 + 1] + 0xbcU) * '\x10' | (byte)(*argv[iVar2 + 1] + 0xbcU) >> 4) {
          case 0:
          case 2:
            nifti_disp_type_list(1);
            return 1;
          case 1:
          case 3:
            nifti_test_datatype_sizes(1);
            return 1;
          default:
            iVar2 = 2;
          }
        }
        else {
          iVar2 = 3;
        }
        nifti_disp_type_list(iVar2);
        return 1;
      }
      iVar3 = strncmp(pcVar7,"-help_hdr",9);
      if (iVar3 == 0) break;
      iVar3 = strncmp(pcVar7,"-help_nim",9);
      if (iVar3 == 0) {
        pcVar7 = *argv;
        iStack_90 = 5;
        goto LAB_00104755;
      }
      iVar3 = strncmp(pcVar7,"-help_ana",9);
      if (iVar3 == 0) {
        pcVar7 = *argv;
        iStack_90 = 6;
        goto LAB_00104755;
      }
      iVar3 = strncmp(pcVar7,"-help",5);
      if (iVar3 == 0) goto LAB_00104750;
      iVar3 = strncmp(pcVar7,"-hist",5);
      if (iVar3 == 0) {
        pcVar7 = *argv;
        iStack_90 = 3;
        goto LAB_00104755;
      }
      cVar1 = *pcVar7;
      if ((cVar1 == '-') && (pcVar7[1] == 'v')) {
        pcVar7 = *argv;
        iStack_90 = 8;
        goto LAB_00104755;
      }
      iVar3 = strncmp(pcVar7,"-nifti_hist",0xb);
      if (iVar3 == 0) {
        nifti_disp_lib_hist();
        return 1;
      }
      iVar3 = strncmp(pcVar7,"-nifti_ver",10);
      if (iVar3 == 0) {
        nifti_disp_lib_version();
        return 1;
      }
      iVar3 = strncmp(pcVar7,"-with_zlib",5);
      if (iVar3 == 0) {
        iVar2 = nifti_compiled_with_zlib();
        pcVar7 = "YES";
        if (iVar2 == 0) {
          pcVar7 = "NO";
        }
        printf("Was NIfTI library compiled with zlib?  %s\n",pcVar7);
        return 1;
      }
      iVar3 = strncmp(pcVar7,"-add_afni_ext",9);
      if (iVar3 == 0) {
        iVar2 = iVar2 + 1;
        if (argc <= iVar2) {
          pcVar7 = "-add_afni_ext";
          goto LAB_0010558f;
        }
        iVar3 = add_string(slist,argv[iVar2]);
        if (iVar3 != 0) {
          return -1;
        }
        iVar3 = add_int(ilist,4);
        if (iVar3 != 0) {
          return -1;
        }
        opts->add_exts = 1;
      }
      else {
        iVar3 = strncmp(pcVar7,"-add_comment_ext",9);
        if (iVar3 == 0) {
          iVar2 = iVar2 + 1;
          if (argc <= iVar2) {
            pcVar7 = "-add_comment_ext";
            goto LAB_0010558f;
          }
          iVar3 = add_string(slist,argv[iVar2]);
          if (iVar3 != 0) {
            return -1;
          }
          iVar3 = add_int(ilist,6);
          if (iVar3 != 0) {
            return -1;
          }
          opts->add_exts = 1;
        }
        else {
          iVar3 = strncmp(pcVar7,"-check_hdr",10);
          if (iVar3 == 0) {
            opts->check_hdr = 1;
          }
          else {
            iVar3 = strncmp(pcVar7,"-check_nim",10);
            if (iVar3 == 0) {
              opts->check_nim = 1;
            }
            else {
              iVar3 = strncmp(pcVar7,"-copy_brick_list",0xb);
              if (((iVar3 == 0) || (iVar3 = strncmp(pcVar7,"-copy_im",10), iVar3 == 0)) ||
                 (iVar3 = strncmp(pcVar7,"-cbl",4), iVar3 == 0)) {
                opts->cbl = 1;
              }
              else {
                iVar3 = strncmp(pcVar7,"-copy_collapsed_image",10);
                if ((iVar3 == 0) || (iVar3 = strncmp(pcVar7,"-cci",4), iVar3 == 0)) {
                  opts->ci_dims[0] = 0;
                  for (lVar11 = 0; lVar11 != 7; lVar11 = lVar11 + 1) {
                    if ((long)uVar5 <= lVar8 + 1 + lVar11) {
                      pcVar7 = "-cci";
                      goto LAB_00105530;
                    }
                    ppuVar6 = __ctype_b_loc();
                    pcVar7 = argv[lVar8 + lVar11 + 1];
                    if (((*(byte *)((long)*ppuVar6 + (long)*pcVar7 * 2 + 1) & 8) == 0) &&
                       (((*pcVar7 != '-' || (pcVar7[1] != '1')) || (pcVar7[2] != '\0')))) {
                      uVar12 = (ulong)((int)lVar11 + 1);
                      pcVar7 = 
                      "** -cci param %d (= \'%s\') is not a valid\n   consider: \'nifti_tool -help\'\n"
                      ;
                      goto LAB_001054e8;
                    }
                    iVar3 = atoi(pcVar7);
                    opts->ci_dims[lVar11 + 1] = iVar3;
                  }
                  iVar2 = iVar2 + (int)lVar11;
                  opts->cci = 1;
                }
                else {
                  iVar3 = strncmp(pcVar7,"-debug",6);
                  if (iVar3 == 0) {
                    iVar2 = iVar2 + 1;
                    if (argc <= iVar2) {
                      pcVar7 = "-debug";
                      goto LAB_0010558f;
                    }
                    iVar3 = atoi(argv[iVar2]);
                    opts->debug = iVar3;
                  }
                  else {
                    iVar3 = strncmp(pcVar7,"-diff_hdr",8);
                    if (iVar3 == 0) {
                      opts->diff_hdr = 1;
                    }
                    else {
                      iVar3 = strncmp(pcVar7,"-diff_nim",8);
                      if (iVar3 == 0) {
                        opts->diff_nim = 1;
                      }
                      else {
                        iVar3 = strncmp(pcVar7,"-disp_exts",7);
                        if (iVar3 == 0) {
                          opts->disp_exts = 1;
                        }
                        else {
                          iVar3 = strncmp(pcVar7,"-disp_hdr",8);
                          if (iVar3 == 0) {
                            opts->disp_hdr = 1;
                          }
                          else {
                            iVar3 = strncmp(pcVar7,"-disp_nim",8);
                            if (iVar3 == 0) {
                              opts->disp_nim = 1;
                            }
                            else {
                              iVar3 = strncmp(pcVar7,"-disp_ana",8);
                              if (iVar3 == 0) {
                                opts->disp_ana = 1;
                              }
                              else {
                                iVar3 = strncmp(pcVar7,"-dci_lines",6);
                                if ((iVar3 == 0) ||
                                   (iVar3 = strncmp(pcVar7,"-dts_lines",6), iVar3 == 0)) {
                                  opts->dci_lines = 1;
                                }
                                else {
                                  iVar3 = strncmp(pcVar7,"-disp_collapsed_image",10);
                                  if ((iVar3 == 0) ||
                                     (iVar3 = strncmp(pcVar7,"-disp_ci",8), iVar3 == 0)) {
                                    opts->ci_dims[0] = 0;
                                    lVar11 = 0;
LAB_00104da0:
                                    if (lVar11 != 7) {
                                      if ((long)uVar5 <= lVar8 + 1 + lVar11) {
                                        pcVar7 = "-disp_ci";
LAB_00105530:
                                        pcVar9 = "7 dimension values are requred";
                                        goto LAB_00105537;
                                      }
                                      ppuVar6 = __ctype_b_loc();
                                      pcVar7 = argv[lVar8 + lVar11 + 1];
                                      if (((*(byte *)((long)*ppuVar6 + (long)*pcVar7 * 2 + 1) & 8)
                                           != 0) ||
                                         (((*pcVar7 == '-' && (pcVar7[1] == '1')) &&
                                          (pcVar7[2] == '\0')))) goto LAB_00104de8;
                                      uVar12 = (ulong)((int)lVar11 + 1);
                                      pcVar7 = 
                                      "** -disp_ci param %d (= \'%s\') is not a valid\n   consider: \'nifti_tool -help\'\n"
                                      ;
                                      goto LAB_001054e8;
                                    }
                                    iVar2 = iVar2 + (int)lVar11;
                                    opts->dci = 1;
                                  }
                                  else {
                                    iVar3 = strncmp(pcVar7,"-disp_ts",10);
                                    if ((iVar3 == 0) ||
                                       (iVar3 = strncmp(pcVar7,"-dts",4), iVar3 == 0)) {
                                      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
                                        if ((long)uVar5 <= lVar8 + 1 + lVar11) {
                                          pcVar7 = "-dts";
                                          pcVar9 = "i,j,k indices are requied\n";
                                          goto LAB_00105537;
                                        }
                                        ppuVar6 = __ctype_b_loc();
                                        if ((*(byte *)((long)*ppuVar6 +
                                                      (long)*argv[lVar8 + lVar11 + 1] * 2 + 1) & 8)
                                            == 0) {
                                          uVar12 = (ulong)((int)lVar11 + 1);
                                          pcVar7 = 
                                          "** -dts param %d (= \'%s\') is not a number\n   consider: \'nifti_tool -help\'\n"
                                          ;
                                          goto LAB_001054e8;
                                        }
                                        iVar3 = atoi(argv[lVar8 + lVar11 + 1]);
                                        opts->ci_dims[lVar11 + 1] = iVar3;
                                      }
                                      opts->ci_dims[0] = 0;
                                      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
                                        opts->ci_dims[lVar8 + 4] = -1;
                                      }
                                      iVar2 = iVar2 + (int)lVar11;
                                      opts->dts = 1;
                                    }
                                    else if (cVar1 == '-') {
                                      if (pcVar7[1] != 'f') {
                                        if ((pcVar7[1] == 'i') && (pcVar7[2] == 'n')) {
                                          iVar3 = iVar2 + 1;
                                          if (iVar2 + 1 < argc) {
                                            iVar3 = argc;
                                          }
                                          iVar10 = 0;
                                          while (lVar8 = lVar8 + 1, iVar4 = iVar3,
                                                lVar8 < (long)uVar5) {
                                            if (*argv[lVar8] == '-') {
                                              iVar3 = iVar2 - iVar10;
                                              iVar4 = iVar3 + 1;
                                              break;
                                            }
                                            iVar4 = add_string(slist_00,argv[lVar8]);
                                            if (iVar4 != 0) {
                                              return -1;
                                            }
                                            iVar10 = iVar10 + -1;
                                          }
                                          iVar2 = iVar4;
                                          if (iVar10 != 0) {
                                            iVar2 = iVar3;
                                          }
                                          if (2 < g_debug) {
                                            fprintf(_stderr,"+d have %d file names\n",
                                                    (ulong)(uint)-iVar10);
                                          }
                                          goto LAB_00104c49;
                                        }
                                        goto LAB_00104ef0;
                                      }
                                      iVar2 = iVar2 + 1;
                                      if (argc <= iVar2) {
                                        pcVar7 = "-field";
                                        goto LAB_0010558f;
                                      }
                                      pcVar7 = argv[iVar2];
                                      slist_01 = &opts->flist;
LAB_00105069:
                                      iVar3 = add_string(slist_01,pcVar7);
                                      if (iVar3 != 0) {
                                        return -1;
                                      }
                                    }
                                    else {
LAB_00104ef0:
                                      iVar3 = strncmp(pcVar7,"-make_image",8);
                                      if (iVar3 == 0) {
                                        opts->make_im = 1;
                                      }
                                      else {
                                        iVar3 = strncmp(pcVar7,"-mod_field",6);
                                        if (iVar3 == 0) {
                                          if (argc <= iVar2 + 1) {
                                            pcVar7 = "-mod_field";
LAB_0010558f:
                                            fprintf(_stderr,"** option \'%s\': missing parameter\n",
                                                    pcVar7);
LAB_00105596:
                                            fwrite("   consider: \'nifti_tool -help\'\n",0x20,1,
                                                   _stderr);
                                            return 1;
                                          }
                                          iVar3 = add_string(&opts->flist,argv[iVar2 + 1]);
                                          if (iVar3 != 0) {
                                            return -1;
                                          }
                                          iVar2 = iVar2 + 2;
                                          if (argc <= iVar2) {
                                            pcVar7 = "-mod_field (2)";
                                            goto LAB_0010558f;
                                          }
                                          pcVar7 = argv[iVar2];
                                          slist_01 = &opts->vlist;
                                          goto LAB_00105069;
                                        }
                                        iVar3 = strncmp(pcVar7,"-mod_hdr",7);
                                        if (iVar3 == 0) {
                                          opts->mod_hdr = 1;
                                        }
                                        else {
                                          iVar3 = strncmp(pcVar7,"-mod_nim",7);
                                          if (iVar3 == 0) {
                                            opts->mod_nim = 1;
                                          }
                                          else {
                                            iVar3 = strncmp(pcVar7,"-keep_hist",5);
                                            if (iVar3 == 0) {
                                              opts->keep_hist = 1;
                                            }
                                            else {
                                              iVar3 = strncmp(pcVar7,"-new_dim",8);
                                              if (iVar3 == 0) {
                                                for (uVar12 = 0; uVar12 != 8; uVar12 = uVar12 + 1) {
                                                  if ((long)uVar5 <= (long)(lVar8 + 1 + uVar12)) {
                                                    pcVar7 = "-new_dim";
                                                    pcVar9 = "8 dim values are requred";
LAB_00105537:
                                                    fprintf(_stderr,"** option \'%s\': %s\n",pcVar7,
                                                            pcVar9);
                                                    goto LAB_00105596;
                                                  }
                                                  ppuVar6 = __ctype_b_loc();
                                                  pcVar7 = argv[lVar8 + uVar12 + 1];
                                                  if (((*(byte *)((long)*ppuVar6 +
                                                                 (long)*pcVar7 * 2 + 1) & 8) == 0)
                                                     && (((*pcVar7 != '-' || (pcVar7[1] != '1')) ||
                                                         (pcVar7[2] != '\0')))) {
                                                    pcVar7 = 
                                                  "** -new_dim param %d (= \'%s\') is not a valid\n   consider: \'nifti_tool -help\'\n"
                                                  ;
LAB_001054e8:
                                                  fprintf(_stderr,pcVar7,uVar12 & 0xffffffff);
                                                  return -1;
                                                  }
                                                  iVar3 = atoi(pcVar7);
                                                  opts->new_dim[uVar12] = iVar3;
                                                }
                                                iVar2 = iVar2 + 8;
                                              }
                                              else {
                                                iVar3 = strncmp(pcVar7,"-new_datatype",10);
                                                if (iVar3 == 0) {
                                                  if (argc <= iVar2 + 1) {
                                                    pcVar7 = "-new_datatype";
                                                    goto LAB_0010558f;
                                                  }
                                                  iVar3 = atoi(argv[iVar2 + 1]);
                                                  opts->new_datatype = iVar3;
LAB_00105268:
                                                  iVar2 = iVar2 + 1;
                                                }
                                                else {
                                                  iVar3 = strncmp(pcVar7,"-overwrite",6);
                                                  if (iVar3 == 0) {
                                                    opts->overwrite = 1;
                                                  }
                                                  else {
                                                    iVar3 = strncmp(pcVar7,"-prefix",4);
                                                    if (iVar3 == 0) {
                                                      if (argc <= iVar2 + 1) {
                                                        pcVar7 = "-prefix";
                                                        goto LAB_0010558f;
                                                      }
                                                      opts->prefix = argv[iVar2 + 1];
                                                      goto LAB_00105268;
                                                    }
                                                    if (((cVar1 == '-') && (pcVar7[1] == 'q')) &&
                                                       (pcVar7[2] == 'u')) {
                                                      opts->debug = 0;
                                                    }
                                                    else {
                                                      iVar3 = strncmp(pcVar7,"-rm_ext",7);
                                                      if (iVar3 == 0) {
                                                        iVar2 = iVar2 + 1;
                                                        if (argc <= iVar2) {
                                                          pcVar7 = "-rm_ext";
                                                          goto LAB_0010558f;
                                                        }
                                                        pcVar7 = argv[iVar2];
                                                        iVar3 = strcmp(pcVar7,"ALL");
                                                        if (iVar3 == 0) {
                                                          pcVar7 = "-1";
                                                        }
                                                        else {
                                                          iVar3 = atoi(pcVar7);
                                                          if ((iVar3 != -1) &&
                                                             ((1000 < iVar3 ||
                                                              (ppuVar6 = __ctype_b_loc(),
                                                              (*(byte *)((long)*ppuVar6 +
                                                                        (long)*pcVar7 * 2 + 1) & 8)
                                                              == 0)))) {
                                                            pcVar9 = 
                                                  "** \'-rm_ext\' requires an extension index (read \'%s\')\n"
                                                  ;
LAB_00105749:
                                                  fprintf(_stderr,pcVar9,pcVar7);
                                                  return -1;
                                                  }
                                                  }
                                                  iVar3 = add_string(slist,pcVar7);
                                                  if (iVar3 != 0) {
                                                    return -1;
                                                  }
                                                  opts->rm_exts = 1;
                                                  }
                                                  else {
                                                    iVar3 = strncmp(pcVar7,"-strip_extras",6);
                                                    if (iVar3 == 0) {
                                                      opts->strip = 1;
                                                    }
                                                    else {
                                                      iVar3 = strncmp(pcVar7,"-swap_as_analyze",0xc)
                                                      ;
                                                      if (iVar3 == 0) {
                                                        opts->swap_ana = 1;
                                                      }
                                                      else {
                                                        iVar3 = strncmp(pcVar7,"-swap_as_nifti",0xc)
                                                        ;
                                                        if (iVar3 == 0) {
                                                          opts->swap_hdr = 1;
                                                        }
                                                        else {
                                                          iVar3 = strncmp(pcVar7,"-swap_as_old",0xc)
                                                          ;
                                                          if (iVar3 != 0) {
                                                            pcVar9 = "** unknown option: \'%s\'\n";
                                                            goto LAB_00105749;
                                                          }
                                                          opts->swap_old = 1;
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_00104c49:
      iVar2 = iVar2 + 1;
    }
    pcVar7 = *argv;
    iStack_90 = 4;
  }
LAB_00104755:
  iVar2 = usage(pcVar7,iStack_90);
  return iVar2;
LAB_00104de8:
  iVar3 = atoi(pcVar7);
  opts->ci_dims[lVar11 + 1] = iVar3;
  lVar11 = lVar11 + 1;
  goto LAB_00104da0;
}

Assistant:

int process_opts( int argc, char * argv[], nt_opts * opts )
{
   int ac;

   memset(opts, 0, sizeof(*opts));

   opts->prefix = NULL;
   opts->debug = 1;  /* init debug level to basic output */

   /* init options for creating a new dataset via "MAKE_IM" */
   opts->new_datatype = NIFTI_TYPE_INT16;
   opts->new_dim[0] = 3;
   opts->new_dim[1] = 1;  opts->new_dim[2] = 1;  opts->new_dim[3] = 1;

   if( argc < 2 ) return usage(argv[0], USE_FULL);

   /* terminal options are first, the rest are sorted */
   for( ac = 1; ac < argc; ac++ )
   {
      if( ! strncmp(argv[ac], "-help_datatypes", 9) )
      {
         ac++;
         if( ac >= argc )
            nifti_disp_type_list(3);  /* show all types */
         else if( argv[ac][0] == 'd' || argv[ac][0] == 'D' )
            nifti_disp_type_list(1);  /* show DT_* types */
         else if( argv[ac][0] == 't' || argv[ac][0] == 'T' )
            nifti_test_datatype_sizes(1); /* test each nbyper and swapsize */
         else
            nifti_disp_type_list(2);  /* show NIFTI_* types */
         return 1;
      }
      else if( ! strncmp(argv[ac], "-help_hdr", 9) )
         return usage(argv[0], USE_FIELD_HDR);
      else if( ! strncmp(argv[ac], "-help_nim", 9) )
         return usage(argv[0], USE_FIELD_NIM);
      else if( ! strncmp(argv[ac], "-help_ana", 9) )
         return usage(argv[0], USE_FIELD_ANA);
      else if( ! strncmp(argv[ac], "-help", 5) )
         return usage(argv[0], USE_FULL);
      else if( ! strncmp(argv[ac], "-hist", 5) )
         return usage(argv[0], USE_HIST);
      else if( ! strncmp(argv[ac], "-ver", 2) )
         return usage(argv[0], USE_VERSION);
      else if( ! strncmp(argv[ac], "-nifti_hist", 11) )
      {
         nifti_disp_lib_hist();
         return 1;
      }
      else if( ! strncmp(argv[ac], "-nifti_ver", 10) )
      {
         nifti_disp_lib_version();
         return 1;
      }
      else if( ! strncmp(argv[ac], "-with_zlib", 5) ) {
         printf("Was NIfTI library compiled with zlib?  %s\n",
                nifti_compiled_with_zlib() ? "YES" : "NO");
         return 1;
      }

      /* begin normal execution options... */
      else if( ! strncmp(argv[ac], "-add_afni_ext", 9) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-add_afni_ext");
         if( add_string(&opts->elist, argv[ac]) ) return -1; /* add extension */
         if( add_int(&opts->etypes, NIFTI_ECODE_AFNI) ) return -1;
         opts->add_exts = 1;
      }
      else if( ! strncmp(argv[ac], "-add_comment_ext", 9) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-add_comment_ext");
         if( add_string(&opts->elist, argv[ac]) ) return -1; /* add extension */
         if( add_int(&opts->etypes, NIFTI_ECODE_COMMENT) ) return -1;
         opts->add_exts = 1;
      }
      else if( ! strncmp(argv[ac], "-check_hdr", 10) )
         opts->check_hdr = 1;
      else if( ! strncmp(argv[ac], "-check_nim", 10) )
         opts->check_nim = 1;
      else if( ! strncmp(argv[ac], "-copy_brick_list", 11) ||
               ! strncmp(argv[ac], "-copy_im", 10) ||
               ! strncmp(argv[ac], "-cbl", 4) )
      {
         opts->cbl = 1;
      }
      else if( ! strncmp(argv[ac], "-copy_collapsed_image", 10) ||
               ! strncmp(argv[ac], "-cci", 4) )
      {
         /* we need to read in the 7 dimension values */
         int index;
         opts->ci_dims[0] = 0;
         for( index = 1; index < 8; index++ )
         {
            ac++;
            CHECK_NEXT_OPT_MSG(ac,argc,"-cci","7 dimension values are requred");
            if( ! isdigit(argv[ac][0]) && strcmp(argv[ac],"-1") ){
               fprintf(stderr,"** -cci param %d (= '%s') is not a valid\n"
                       "   consider: 'nifti_tool -help'\n",index,argv[ac]);
               return -1;
            }
            opts->ci_dims[index] = atoi(argv[ac]);
         }

         opts->cci = 1;
      }
      else if( ! strncmp(argv[ac], "-debug", 6) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-debug");
         opts->debug = atoi(argv[ac]);
      }
      else if( ! strncmp(argv[ac], "-diff_hdr", 8) )
         opts->diff_hdr = 1;
      else if( ! strncmp(argv[ac], "-diff_nim", 8) )
         opts->diff_nim = 1;
      else if( ! strncmp(argv[ac], "-disp_exts", 7) )
         opts->disp_exts = 1;
      else if( ! strncmp(argv[ac], "-disp_hdr", 8) )
         opts->disp_hdr = 1;
      else if( ! strncmp(argv[ac], "-disp_nim", 8) )
         opts->disp_nim = 1;
      else if( ! strncmp(argv[ac], "-disp_ana", 8) )
         opts->disp_ana = 1;
      else if( ! strncmp(argv[ac], "-dci_lines", 6) ||   /* before -dts */
               ! strncmp(argv[ac], "-dts_lines", 6) )
      {
         opts->dci_lines = 1;
      }
      else if( ! strncmp(argv[ac], "-disp_collapsed_image", 10) ||
               ! strncmp(argv[ac], "-disp_ci", 8) )
      {
         /* we need to read in the 7 dimension values */
         int index;
         opts->ci_dims[0] = 0;
         for( index = 1; index < 8; index++ )
         {
            ac++;
            CHECK_NEXT_OPT_MSG(ac,argc,"-disp_ci",
                               "7 dimension values are requred");
            if( ! isdigit(argv[ac][0]) && strcmp(argv[ac],"-1") ){
               fprintf(stderr,"** -disp_ci param %d (= '%s') is not a valid\n"
                       "   consider: 'nifti_tool -help'\n",index,argv[ac]);
               return -1;
            }
            opts->ci_dims[index] = atoi(argv[ac]);
         }

         opts->dci = 1;
      }
      else if( ! strncmp(argv[ac], "-disp_ts", 10) ||
               ! strncmp(argv[ac], "-dts", 4) )
      {
         /* we need to read in the ijk indices into the ci_dims array */
         int index;
         for( index = 1; index <= 3; index++ )
         {
            ac++;
            CHECK_NEXT_OPT_MSG(ac,argc,"-dts","i,j,k indices are requied\n");
            if( ! isdigit(argv[ac][0]) ){
               fprintf(stderr,"** -dts param %d (= '%s') is not a number\n"
                       "   consider: 'nifti_tool -help'\n",index,argv[ac]);
               return -1;
            }
            opts->ci_dims[index] = atoi(argv[ac]);
         }
         /* and fill the rest of the array */
         opts->ci_dims[0] = 0;
         for( index = 4; index < 8; index++ ) opts->ci_dims[index] = -1;

         opts->dts = 1;
      }
      else if( ! strncmp(argv[ac], "-field", 2) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-field");
         if( add_string(&opts->flist, argv[ac]) ) return -1; /* add field */
      }
      else if( ! strncmp(argv[ac], "-infiles", 3) )
      {
         int count;
         /* for -infiles, get all next arguments until a '-' or done */
         ac++;
         for( count = 0; (ac < argc) && (argv[ac][0] != '-'); ac++, count++ )
            if( add_string(&opts->infiles, argv[ac]) ) return -1;/* add field */
         if( count > 0 && ac < argc ) ac--;  /* more options to process */
         if( g_debug > 2 ) fprintf(stderr,"+d have %d file names\n", count);
      }
      else if( ! strncmp(argv[ac], "-make_image", 8) )
      {
         opts->make_im = 1;  /* will setup later, as -cbl and MAKE_IM */
      }
      else if( ! strncmp(argv[ac], "-mod_field", 6) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-mod_field");
         if( add_string(&opts->flist, argv[ac]) ) return -1; /* add field */
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-mod_field (2)");
         if( add_string(&opts->vlist, argv[ac]) ) return -1; /* add value */
      }
      else if( ! strncmp(argv[ac], "-mod_hdr", 7) )
         opts->mod_hdr = 1;
      else if( ! strncmp(argv[ac], "-mod_nim", 7) )
         opts->mod_nim = 1;
      else if( ! strncmp(argv[ac], "-keep_hist", 5) )
         opts->keep_hist = 1;
      else if( ! strncmp(argv[ac], "-new_dim", 8) )
      {
         /* we need to read in the 8 dimension values */
         int index;
         for( index = 0; index < 8; index++ )
         {
            ac++;
            CHECK_NEXT_OPT_MSG(ac,argc,"-new_dim","8 dim values are requred");
            if( ! isdigit(argv[ac][0]) && strcmp(argv[ac],"-1") ){
               fprintf(stderr,"** -new_dim param %d (= '%s') is not a valid\n"
                       "   consider: 'nifti_tool -help'\n",index,argv[ac]);
               return -1;
            }
            opts->new_dim[index] = atoi(argv[ac]);
         }
      }
      else if( ! strncmp(argv[ac], "-new_datatype", 10) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-new_datatype");
         opts->new_datatype = atoi(argv[ac]);
      }
      else if( ! strncmp(argv[ac], "-overwrite", 6) )
         opts->overwrite = 1;
      else if( ! strncmp(argv[ac], "-prefix", 4) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-prefix");
         opts->prefix = argv[ac];
      }
      else if( ! strncmp(argv[ac], "-quiet", 3) )
         opts->debug = 0;
      else if( ! strncmp(argv[ac], "-rm_ext", 7) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-rm_ext");
         if( strcmp(argv[ac],"ALL") == 0 )  /* special case, pass -1 */
         {
            if( add_string(&opts->elist, "-1") ) return -1;
         }
         else
         {
            int index = atoi(argv[ac]);
            if( (index != -1) && ((index > 1000) || !isdigit(*argv[ac])) ){
               fprintf(stderr,
                    "** '-rm_ext' requires an extension index (read '%s')\n",
                    argv[ac]);
               return -1;
            }
            if( add_string(&opts->elist, argv[ac]) ) return -1;
         }
         opts->rm_exts = 1;
      }
      else if( ! strncmp(argv[ac], "-strip_extras", 6) )
         opts->strip = 1;
      else if( ! strncmp(argv[ac], "-swap_as_analyze", 12) )
         opts->swap_ana = 1;
      else if( ! strncmp(argv[ac], "-swap_as_nifti", 12) )
         opts->swap_hdr = 1;
      else if( ! strncmp(argv[ac], "-swap_as_old", 12) )
         opts->swap_old = 1;
      else
      {
         fprintf(stderr,"** unknown option: '%s'\n", argv[ac]);
         return -1;
      }
   }

   if( opts->make_im )
   {
      if( opts->infiles.len > 0 )
      {
         fprintf(stderr,"** -infiles is invalid when using -make_im\n");
         return -1;
      }
      /* apply -make_im via -cbl and "MAKE_IM" */
      opts->cbl = 1;
      if( add_string(&opts->infiles, NT_MAKE_IM_NAME) ) return -1;
   }

   /* verify for programming purposes */
   if( opts->add_exts && ( opts->elist.len != opts->etypes.len ) )
   {
      fprintf(stderr,"** ext list length (%d) != etype length (%d)\n",
              opts->elist.len, opts->etypes.len);
      return -1;
   }

   g_debug = opts->debug;
   nifti_set_debug_level(g_debug);

   fill_cmd_string(opts, argc, argv);  /* copy this command */

   if( g_debug > 2 ) disp_nt_opts("options read: ", opts);

   return 0;
}